

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O2

float gimage::expandGaussPixel<unsigned_char>
                (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,long i,long k,
                int j)

{
  long k_00;
  long lVar1;
  long i_00;
  work_t wVar2;
  work_t wVar3;
  work_t wVar4;
  work_t wVar5;
  work_t wVar6;
  work_t wVar7;
  work_t wVar8;
  work_t wVar9;
  work_t wVar10;
  long ii_1;
  long i_01;
  long ii;
  long lVar11;
  float fVar12;
  
  i_01 = i >> 1;
  lVar11 = k >> 1;
  if ((i & 1U) == 0) {
    lVar1 = i_01 + -1;
    if ((k & 1U) == 0) {
      k_00 = lVar11 + -1;
      wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,lVar1,k_00,j);
      wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,k_00,j);
      i_00 = i_01 + 1;
      wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_00,k_00,j);
      wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,lVar1,lVar11,j);
      wVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11,j);
      wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_00,lVar11,j);
      lVar11 = lVar11 + 1;
      wVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,lVar1,lVar11,j);
      wVar9 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11,j);
      wVar10 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                         (image,i_00,lVar11,j);
      fVar12 = (float)wVar10 * 0.0039062 + (float)wVar8 * 0.0039062 + (float)wVar9 * 0.0234375 +
               (float)wVar7 * 0.0234375 + (float)wVar5 * 0.0234375 + (float)wVar6 * 0.140625 +
               (float)wVar4 * 0.0039062 + (float)wVar2 * 0.0039062 + (float)wVar3 * 0.0234375;
    }
    else {
      wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,lVar1,lVar11,j);
      wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11,j);
      wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01 + 1,lVar11,j);
      lVar11 = lVar11 + 1;
      wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,lVar1,lVar11,j);
      wVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11,j);
      wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01 + 1,lVar11,j);
      fVar12 = (float)wVar7 * 0.015625 + (float)wVar5 * 0.015625 + (float)wVar6 * 0.09375 +
               (float)wVar4 * 0.015625 + (float)wVar2 * 0.015625 + (float)wVar3 * 0.09375;
    }
  }
  else {
    if ((k & 1U) != 0) {
      wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11,j);
      wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01 + 1,lVar11,j);
      wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01,lVar11 + 1,j);
      wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                        (image,i_01 + 1,lVar11 + 1,j);
      return (float)((wVar5 + wVar4 + wVar3 + wVar2) / 4);
    }
    wVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,i_01,lVar11 + -1,j);
    lVar1 = i_01 + 1;
    wVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,lVar1,lVar11 + -1,j);
    wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,i_01,lVar11,j);
    wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,lVar1,lVar11,j);
    wVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,i_01,lVar11 + 1,j);
    wVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBounds
                      (image,lVar1,lVar11 + 1,j);
    fVar12 = (float)wVar6 * 0.015625 + (float)wVar7 * 0.015625 +
             (float)wVar4 * 0.09375 + (float)wVar5 * 0.09375 +
             (float)wVar2 * 0.015625 + (float)wVar3 * 0.015625;
  }
  return fVar12 * 4.0;
}

Assistant:

float expandGaussPixel(const Image<T> &image, long i, long k, int j)
{
  static const float g[5][5]=
  {
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0234375f, 0.0937500f, 0.1406250f, 0.0937500f, 0.0234375f},
    { 0.0156250f, 0.0625000f, 0.0937500f, 0.0625000f, 0.0156250f},
    { 0.0039062f, 0.0156250f, 0.0234375f, 0.0156250f, 0.0039062f},
  };

  float ret;

  if (i&0x1)
  {
    if (k&0x1)
    {
      long ii=i>>1;
      long kk=k>>1;

      ret=static_cast<float>((image.getBounds(ii, kk, j)+image.getBounds(ii+1, kk, j)+
                             image.getBounds(ii, kk+1, j)+image.getBounds(ii+1, kk+1, j))/4);
    }
    else
    {
      long ii=i>>1;
      long kk=(k>>1)-1;

      ret =g[0][1]*image.getBounds(ii, kk, j)+g[0][3]*image.getBounds(ii+1, kk, j);
      ret+=g[2][1]*image.getBounds(ii, kk+1, j)+g[2][3]*image.getBounds(ii+1, kk+1, j);
      ret+=g[4][1]*image.getBounds(ii, kk+2, j)+g[4][3]*image.getBounds(ii+1, kk+2, j);
      ret*=4;
    }
  }
  else
  {
    if (k&0x1)
    {
      long ii=(i>>1)-1;
      long kk=k>>1;

      ret =g[1][0]*image.getBounds(ii, kk, j)+g[1][2]*image.getBounds(ii+1, kk, j)+g[1][4]*image.getBounds(ii+2, kk, j);
      ret+=g[3][0]*image.getBounds(ii, kk+1, j)+g[3][2]*image.getBounds(ii+1, kk+1, j)+g[3][4]*image.getBounds(ii+2, kk+1, j);
      ret*=4;
    }
    else
    {
      long ii=(i>>1)-1;
      long kk=(k>>1)-1;

      ret =g[0][0]*image.getBounds(ii, kk, j)+g[0][2]*image.getBounds(ii+1, kk, j)+g[0][4]*image.getBounds(ii+2, kk, j);
      ret+=g[2][0]*image.getBounds(ii, kk+1, j)+g[2][2]*image.getBounds(ii+1, kk+1, j)+g[2][4]*image.getBounds(ii+2, kk+1, j);
      ret+=g[4][0]*image.getBounds(ii, kk+2, j)+g[4][2]*image.getBounds(ii+1, kk+2, j)+g[4][4]*image.getBounds(ii+2, kk+2, j);
      ret*=4;
    }
  }

  return ret;
}